

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O2

int llhttp__internal__c_mul_add_status_code
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 1;
  uVar2 = (uint)state->status_code;
  if (uVar2 < 0x199a) {
    uVar3 = uVar2 * 10;
    state->status_code = (uint16_t)uVar3;
    if (match < 0) {
      if (uVar3 < (uint)-match) {
        return 1;
      }
    }
    else if (SBORROW4(0xffff - match,uVar3) != (int)((0xffff - match) + uVar2 * -10) < 0) {
      return 1;
    }
    state->status_code = (short)match + (uint16_t)uVar3;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int llhttp__internal__c_mul_add_status_code(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->status_code > 0xffff / 10) {
    return 1;
  }
  
  state->status_code *= 10;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->status_code > 0xffff - match) {
      return 1;
    }
  } else {
    if (state->status_code < 0 - match) {
      return 1;
    }
  }
  state->status_code += match;
  return 0;
}